

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void mul128By64To192(uint64_t a0,uint64_t a1,uint64_t b,uint64_t *z0Ptr,uint64_t *z1Ptr,
                    uint64_t *z2Ptr)

{
  uint64_t local_58;
  uint64_t more1;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t *z2Ptr_local;
  uint64_t *z1Ptr_local;
  uint64_t *z0Ptr_local;
  uint64_t b_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  z0 = (uint64_t)z2Ptr;
  z2Ptr_local = z1Ptr;
  z1Ptr_local = z0Ptr;
  z0Ptr_local = (uint64_t *)b;
  b_local = a1;
  a1_local = a0;
  mul64To128(a1,b,&z2,&more1);
  mul64To128(a1_local,(uint64_t)z0Ptr_local,&z1,&local_58);
  add128(z1,local_58,0,z2,&z1,&z2);
  *(uint64_t *)z0 = more1;
  *z2Ptr_local = z2;
  *z1Ptr_local = z1;
  return;
}

Assistant:

static inline void
 mul128By64To192(
     uint64_t a0,
     uint64_t a1,
     uint64_t b,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr
 )
{
    uint64_t z0, z1, z2, more1;

    mul64To128( a1, b, &z1, &z2 );
    mul64To128( a0, b, &z0, &more1 );
    add128( z0, more1, 0, z1, &z0, &z1 );
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}